

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

Sdk * __thiscall sensors_analytics::Sdk::GetCookie_abi_cxx11_(Sdk *this,bool decode)

{
  allocator local_4d [20];
  undefined1 local_39;
  string local_38 [8];
  string cookie;
  bool decode_local;
  string *decodeCookie;
  
  if (instance_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  else {
    std::__cxx11::string::string(local_38,*(string **)(instance_ + 0x68));
    local_39 = 0;
    if (decode) {
      utils::UrlDecode((utils *)this,(string *)local_38);
    }
    else {
      std::__cxx11::string::string((string *)this,local_38);
    }
    local_39 = 1;
    std::__cxx11::string::~string(local_38);
  }
  return this;
}

Assistant:

string Sdk::GetCookie(bool decode) {
    if (instance_) {
        string cookie = instance_->consumer_->request_header_cookie;
        string decodeCookie = decode ? utils::UrlDecode(cookie) : cookie;
        return decodeCookie;
    }
    return "";
}